

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

Vec_Int_t * Vec_WecInsertLevel(Vec_Wec_t *p,int i)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int nCapMin;
  
  iVar2 = p->nSize;
  if (iVar2 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < iVar2) {
      nCapMin = iVar2 * 2;
    }
    Vec_WecGrow(p,nCapMin);
    iVar2 = p->nSize;
  }
  p->nSize = iVar2 + 1U;
  if (-1 < iVar2) {
    pVVar3 = p->pArray;
    pVVar4 = pVVar3 + ((ulong)(iVar2 + 1U) - 2);
    while (pVVar3 <= pVVar4) {
      iVar2 = pVVar4->nSize;
      piVar1 = pVVar4->pArray;
      pVVar4[1].nCap = pVVar4->nCap;
      pVVar4[1].nSize = iVar2;
      pVVar4[1].pArray = piVar1;
      pVVar4 = pVVar4 + -1;
      pVVar3 = p->pArray;
    }
    pVVar3->nCap = 0;
    pVVar3->nSize = 0;
    pVVar3->pArray = (int *)0x0;
    return pVVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x142,"Vec_Int_t *Vec_WecInsertLevel(Vec_Wec_t *, int)");
}

Assistant:

static inline Vec_Int_t * Vec_WecInsertLevel( Vec_Wec_t * p, int i )
{
    Vec_Int_t * pTemp;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    assert( i >= 0 && i < p->nSize );
    for ( pTemp = p->pArray + p->nSize - 2; pTemp >= p->pArray + i; pTemp-- )
        pTemp[1] = pTemp[0];
    Vec_IntZero( p->pArray + i );
    return p->pArray + i;
}